

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8 * google::protobuf::internal::WireFormat::InternalSerializeWithCachedSizesToArray
                  (Message *message,uint8 *target,EpsCopyOutputStream *stream)

{
  FieldDescriptor **ppFVar1;
  int iVar2;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar4;
  uint8 *puVar5;
  Reflection *this;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  long lVar6;
  long lVar7;
  FieldDescriptor **ppFVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  Reflection *local_40;
  FieldDescriptor *local_38;
  long lVar3;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (FieldDescriptor **)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor **)0x0;
  local_58.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldDescriptor **)0x0;
  local_40 = this;
  if (*(char *)(*(long *)(lVar3 + 0x20) + 0x4b) == '\x01') {
    ppFVar8 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (0 < *(int *)(lVar3 + 0x68)) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        local_38 = (FieldDescriptor *)(*(long *)(lVar3 + 0x28) + lVar6);
        if (local_58.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_38;
          local_58.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x98;
        ppFVar8 = local_58.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar1 = local_58.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar7 < *(int *)(lVar3 + 0x68));
    }
  }
  else {
    Reflection::ListFields(this,message,&local_58);
    ppFVar8 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = local_58.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppFVar8 != ppFVar1; ppFVar8 = ppFVar8 + 1) {
    target = InternalSerializeField(*ppFVar8,message,target,stream);
  }
  if (*(char *)(*(long *)(lVar3 + 0x20) + 0x48) == '\0') {
    pUVar4 = Reflection::GetUnknownFields(local_40,message);
    puVar5 = InternalSerializeUnknownFieldsToArray(pUVar4,target,stream);
  }
  else {
    pUVar4 = Reflection::GetUnknownFields(local_40,message);
    puVar5 = InternalSerializeUnknownMessageSetItemsToArray(pUVar4,target,stream);
  }
  if (local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (FieldDescriptor **)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return puVar5;
}

Assistant:

uint8* WireFormat::InternalSerializeWithCachedSizesToArray(
    const Message& message, uint8* target, io::EpsCopyOutputStream* stream) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (auto field : fields) {
    target = InternalSerializeField(field, message, target, stream);
  }

  if (descriptor->options().message_set_wire_format()) {
    return InternalSerializeUnknownMessageSetItemsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  } else {
    return InternalSerializeUnknownFieldsToArray(
        message_reflection->GetUnknownFields(message), target, stream);
  }
}